

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_asm.c
# Opt level: O0

void emit_asm_bytes(BuildCtx *ctx,uint8_t *p,int n)

{
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  int i;
  uint local_18;
  
  for (local_18 = 0; (int)local_18 < (int)in_EDX; local_18 = local_18 + 1) {
    if ((local_18 & 0xf) == 0) {
      fprintf(*(FILE **)(in_RDI + 0x10),"\t.byte %d",(ulong)*(byte *)(in_RSI + (int)local_18));
    }
    else {
      fprintf(*(FILE **)(in_RDI + 0x10),",%d",(ulong)*(byte *)(in_RSI + (int)local_18));
    }
    if ((local_18 & 0xf) == 0xf) {
      putc(10,*(FILE **)(in_RDI + 0x10));
    }
  }
  if ((in_EDX & 0xf) != 0) {
    putc(10,*(FILE **)(in_RDI + 0x10));
  }
  return;
}

Assistant:

static void emit_asm_bytes(BuildCtx *ctx, uint8_t *p, int n)
{
  int i;
  for (i = 0; i < n; i++) {
    if ((i & 15) == 0)
      fprintf(ctx->fp, "\t.byte %d", p[i]);
    else
      fprintf(ctx->fp, ",%d", p[i]);
    if ((i & 15) == 15) putc('\n', ctx->fp);
  }
  if ((n & 15) != 0) putc('\n', ctx->fp);
}